

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<unsigned_char_const&>::operator==
          (expression_lhs<const_unsigned_char_&> *this,int *rhs)

{
  uint *in_RDX;
  undefined8 *in_RSI;
  result *in_RDI;
  string *in_stack_00000110;
  uchar *in_stack_00000118;
  result *in_stack_fffffffffffffee8;
  result *this_00;
  string *this_01;
  result *this_02;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  result local_68 [2];
  
  local_68[0]._39_1_ = (uint)*(byte *)*in_RSI == *in_RDX;
  this_02 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"==",&local_c9);
  this_01 = local_a8;
  std::__cxx11::string::string(this_01,local_c8);
  to_string<unsigned_char,int>(in_stack_00000118,in_stack_00000110,(int *)this);
  this_00 = local_68;
  std::__cxx11::string::string((string *)this_00,local_88);
  result::result<bool>(this_02,(bool *)this_01,(text *)this_00);
  result::result(this_00,in_stack_fffffffffffffee8);
  result::~result((result *)0x12f959);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return in_RDI;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }